

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fade_group.cpp
# Opt level: O0

Am_Style clear_halftone(int percent)

{
  bool bVar1;
  int iVar2;
  int in_ESI;
  undefined4 in_register_0000003c;
  Am_Style_Data *this;
  Am_Style *local_50;
  Am_Style local_38;
  Am_Style local_30 [3];
  int local_14;
  Am_Style_Data *pAStack_10;
  int percent_local;
  
  this = (Am_Style_Data *)CONCAT44(in_register_0000003c,percent);
  if (in_ESI < 0) {
    local_14 = 0;
  }
  else {
    local_14 = in_ESI;
    if (99 < in_ESI) {
      local_14 = 99;
    }
  }
  pAStack_10 = this;
  if ((clear_halftone(int)::halftone_array == '\0') &&
     (iVar2 = __cxa_guard_acquire(&clear_halftone(int)::halftone_array), iVar2 != 0)) {
    local_50 = (Am_Style *)clear_halftone(int)::halftone_array;
    do {
      Am_Style::Am_Style(local_50);
      local_50 = local_50 + 1;
    } while (local_50 != (Am_Style *)&clear_halftone(int)::halftone_array);
    __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
    __cxa_guard_release(&clear_halftone(int)::halftone_array);
  }
  bVar1 = Am_Style::Valid((Am_Style *)(clear_halftone(int)::halftone_array + (long)local_14 * 8));
  if (!bVar1) {
    Am_Style::Halftone_Stipple(&local_38,local_14,Am_FILL_STIPPLED);
    Am_Style::Clone_With_New_Color(local_30,&local_38);
    Am_Style::operator=((Am_Style *)(clear_halftone(int)::halftone_array + (long)local_14 * 8),
                        local_30);
    Am_Style::~Am_Style(local_30);
    Am_Style::~Am_Style(&local_38);
  }
  Am_Style::Am_Style((Am_Style *)this,
                     (Am_Style *)(clear_halftone(int)::halftone_array + (long)local_14 * 8));
  return (Am_Style)this;
}

Assistant:

static Am_Style
clear_halftone(int percent)
{
  if (percent < 0)
    percent = 0;
  else if (percent > 99)
    percent = 99;
  static Am_Style halftone_array[100];
  if (!halftone_array[percent].Valid())
    halftone_array[percent] =
        Am_Style::Halftone_Stipple(percent).Clone_With_New_Color(Am_Off_Bits);
  return halftone_array[percent];
}